

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

Profiler * __thiscall Js::ScriptContext::CreateProfiler(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  NoCheckHeapAllocator *alloc;
  ScriptContextProfiler *pSVar4;
  ThreadContext *this_00;
  PageAllocator *pageAllocator;
  Recycler *pRVar5;
  Profiler *pPVar6;
  Profiler *profiler;
  Profiler *backgroundProfiler;
  Profiler *oldProfiler;
  TrackAllocData local_40;
  ScriptContext *local_18;
  ScriptContext *this_local;
  
  local_18 = this;
  if (this->profiler != (ScriptContextProfiler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xc5f,"(profiler == nullptr)","profiler == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ProfileFlag);
  if (bVar2) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&ScriptContextProfiler::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0xc62);
    alloc = Memory::NoCheckHeapAllocator::TrackAllocInfo
                      ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_40);
    pSVar4 = (ScriptContextProfiler *)new<Memory::NoCheckHeapAllocator>(0x40,alloc,0x3d5f00);
    ScriptContextProfiler::ScriptContextProfiler(pSVar4);
    this->profiler = pSVar4;
    pSVar4 = this->profiler;
    this_00 = GetThreadContext(this);
    pageAllocator = ThreadContext::GetPageAllocator(this_00);
    pRVar5 = ThreadContext::GetRecycler(this->threadContext);
    ScriptContextProfiler::Initialize(pSVar4,pageAllocator,pRVar5);
    CreateProfilerNativeCodeGen(this->nativeCodeGen,this->profiler);
    this->isProfilerCreated = true;
    pRVar5 = ThreadContext::GetRecycler(this->threadContext);
    pPVar6 = Memory::Recycler::GetProfiler(pRVar5);
    pRVar5 = ThreadContext::GetRecycler(this->threadContext);
    profiler = ScriptContextProfiler::GetProfiler(this->profiler);
    backgroundProfiler = ScriptContextProfiler::GetBackgroundRecyclerProfiler(this->profiler);
    Memory::Recycler::SetProfiler(pRVar5,profiler,backgroundProfiler);
    this_local = (ScriptContext *)pPVar6;
  }
  else {
    this_local = (ScriptContext *)0x0;
  }
  return (Profiler *)this_local;
}

Assistant:

Profiler *
        ScriptContext::CreateProfiler()
    {
            Assert(profiler == nullptr);
            if (Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))
            {
                this->profiler = NoCheckHeapNew(ScriptContextProfiler);
                this->profiler->Initialize(GetThreadContext()->GetPageAllocator(), threadContext->GetRecycler());

#if ENABLE_NATIVE_CODEGEN
                CreateProfilerNativeCodeGen(this->nativeCodeGen, this->profiler);
#endif

                this->isProfilerCreated = true;
                Profiler * oldProfiler = this->threadContext->GetRecycler()->GetProfiler();
                this->threadContext->GetRecycler()->SetProfiler(this->profiler->GetProfiler(), this->profiler->GetBackgroundRecyclerProfiler());
                return oldProfiler;
            }
            return nullptr;
    }